

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::End(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  ImGuiContext *g;
  char *__function;
  float fVar6;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if ((pIVar2->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
    EndColumns();
  }
  PopClipRect();
  if ((pIVar2->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  iVar1 = (pIVar3->CurrentWindowStack).Size;
  if (0 < iVar1) {
    uVar5 = iVar1 - 1;
    (pIVar3->CurrentWindowStack).Size = uVar5;
    if ((pIVar2->Flags & 0x4000000) != 0) {
      iVar1 = (pIVar3->CurrentPopupStack).Size;
      if (iVar1 < 1) {
        __function = "void ImVector<ImGuiPopupRef>::pop_back() [T = ImGuiPopupRef]";
        goto LAB_0017e1a2;
      }
      (pIVar3->CurrentPopupStack).Size = iVar1 + -1;
    }
    pIVar4 = GImGui;
    if ((pIVar2->DC).StackSizesBackup[0] != (pIVar2->IDStack).Size) {
      __assert_fail("*p_backup == current && \"PushID/PopID or TreeNode/TreePop Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x14dc,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar2->DC).StackSizesBackup[1] != (pIVar2->DC).GroupStack.Size) {
      __assert_fail("*p_backup == current && \"BeginGroup/EndGroup Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x14dd,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar2->DC).StackSizesBackup[2] != (GImGui->CurrentPopupStack).Size) {
      __assert_fail("*p_backup == current && \"BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x14de,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((GImGui->ColorModifiers).Size <= (pIVar2->DC).StackSizesBackup[3]) {
      if ((pIVar2->DC).StackSizesBackup[4] < (GImGui->StyleModifiers).Size) {
        __assert_fail("*p_backup >= current && \"PushStyleVar/PopStyleVar Mismatch!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x14e1,"void CheckStacksSize(ImGuiWindow *, bool)");
      }
      if ((GImGui->FontStack).Size <= (pIVar2->DC).StackSizesBackup[5]) {
        if (uVar5 == 0) {
          GImGui->CurrentWindow = (ImGuiWindow *)0x0;
        }
        else {
          pIVar2 = (pIVar3->CurrentWindowStack).Data[(ulong)uVar5 - 1];
          GImGui->CurrentWindow = pIVar2;
          if (pIVar2 != (ImGuiWindow *)0x0) {
            fVar6 = pIVar4->FontBaseSize * pIVar2->FontWindowScale;
            (pIVar4->DrawListSharedData).FontSize = fVar6;
            pIVar4->FontSize = fVar6;
          }
        }
        return;
      }
      __assert_fail("*p_backup >= current && \"PushFont/PopFont Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x14e2,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    __assert_fail("*p_backup >= current && \"PushStyleColor/PopStyleColor Mismatch!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x14e0,"void CheckStacksSize(ImGuiWindow *, bool)");
  }
  __function = "void ImVector<ImGuiWindow *>::pop_back() [T = ImGuiWindow *]";
LAB_0017e1a2:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4e1,__function);
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (window->DC.ColumnsSet != NULL)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.CurrentPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}